

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# windows.cpp
# Opt level: O2

void __thiscall setup::windows_version::load(windows_version *this,istream *is,version *version)

{
  byte bVar1;
  uint uVar2;
  
  data::load(&this->win_version,is,version);
  data::load(&this->nt_version,is,version);
  if (version->value < 0x1031300) {
    (this->nt_service_pack).minor = 0;
    uVar2 = 0;
  }
  else {
    bVar1 = util::load<unsigned_char,util::little_endian>(is);
    (this->nt_service_pack).minor = (uint)bVar1;
    bVar1 = util::load<unsigned_char,util::little_endian>(is);
    uVar2 = (uint)bVar1;
  }
  (this->nt_service_pack).major = uVar2;
  return;
}

Assistant:

void windows_version::load(std::istream & is, const version & version) {
	
	win_version.load(is, version);
	nt_version.load(is, version);
	
	if(version >= INNO_VERSION(1, 3, 19)) {
		nt_service_pack.minor = util::load<boost::uint8_t>(is);
		nt_service_pack.major = util::load<boost::uint8_t>(is);
	} else {
		nt_service_pack.major = 0, nt_service_pack.minor = 0;
	}
	
}